

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

int Llb_CoreReachability(Llb_Img_t *p)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *vStop;
  ulong uVar8;
  Vec_Int_t *vStart;
  Aig_Man_t *p_00;
  Gia_ParLlb_t *pGVar9;
  Vec_Ptr_t *vQuant0;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *local_30;
  Vec_Ptr_t *local_28;
  
  pGVar9 = p->pPars;
  if (pGVar9->fBackward == 0) {
    p_00 = p->pAig;
    pVVar7 = p->vDdMans;
    vStart = p->vVarsCs;
    vStop = p->vVarsNs;
  }
  else {
    pVVar7 = p->vDdMans;
    uVar1 = pVVar7->nSize;
    lVar6 = (long)(int)uVar1;
    if (1 < lVar6) {
      uVar8 = 0;
      do {
        lVar6 = lVar6 + -1;
        ppvVar2 = pVVar7->pArray;
        pvVar3 = ppvVar2[uVar8];
        ppvVar2[uVar8] = ppvVar2[lVar6];
        pVVar7->pArray[lVar6] = pvVar3;
        uVar8 = uVar8 + 1;
      } while (uVar1 >> 1 != uVar8);
      pGVar9 = p->pPars;
      pVVar7 = p->vDdMans;
    }
    vStart = p->vVarsNs;
    p_00 = p->pAig;
    vStop = p->vVarsCs;
  }
  pVVar7 = Llb_ImgSupports(p_00,pVVar7,vStart,vStop,0,pGVar9->fVeryVerbose);
  Llb_ImgSchedule(pVVar7,&local_30,&local_28,p->pPars->fVeryVerbose);
  iVar4 = pVVar7->nSize;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar4 = pVVar7->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  Llb_ImgQuantifyFirst(p->pAig,p->vDdMans,local_30,p->pPars->fVeryVerbose);
  iVar5 = Llb_CoreReachability_int(p,local_30,local_28);
  iVar4 = local_30->nSize;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      pvVar3 = local_30->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar4 = local_30->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  if (local_30->pArray != (void **)0x0) {
    free(local_30->pArray);
  }
  free(local_30);
  iVar4 = local_28->nSize;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      pvVar3 = local_28->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar4 = local_28->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  if (local_28->pArray != (void **)0x0) {
    free(local_28->pArray);
  }
  free(local_28);
  return iVar5;
}

Assistant:

int Llb_CoreReachability( Llb_Img_t * p )
{
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    int RetValue;
    // get supports and quantified variables
    if ( p->pPars->fBackward )
    {
        Vec_PtrReverseOrder( p->vDdMans );
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 0, p->pPars->fVeryVerbose );
    }
    else
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsCs, p->vVarsNs, 0, p->pPars->fVeryVerbose );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, p->pPars->fVeryVerbose );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    // remove variables
    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0, p->pPars->fVeryVerbose );
    // perform reachability
    RetValue = Llb_CoreReachability_int( p, vQuant0, vQuant1 );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return RetValue;
}